

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strcasestr.c
# Opt level: O0

char * nn_strcasestr(char *str,char *key)

{
  int iVar1;
  char *in_RSI;
  char *in_RDI;
  size_t len;
  char *in_stack_fffffffffffffff8;
  
  strlen(in_RSI);
  while( true ) {
    if (*in_RDI == '\0') {
      return (char *)0x0;
    }
    iVar1 = nn_strncasecmp(in_stack_fffffffffffffff8,in_RDI,(size_t)in_RSI);
    if (iVar1 == 0) break;
    in_RDI = in_RDI + 1;
  }
  return in_RDI;
}

Assistant:

const char *
nn_strcasestr(const char *str, const char *key)
{
	size_t len = strlen(key);

	while (*str != '\0') {
		if (nn_strncasecmp(str, key, len) == 0) {
			return str;
		}
		str++;
	}
	return (NULL);
}